

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O3

void __thiscall Omega_h::Adj::Adj(Adj *this,LOs *ab2b_,Read<signed_char> *codes_)

{
  void *pvVar1;
  int iVar2;
  Alloc *pAVar3;
  
  pAVar3 = (ab2b_->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      pAVar3 = (Alloc *)(pAVar3->size * 8 + 1);
    }
    else {
      pAVar3->use_count = pAVar3->use_count + 1;
    }
  }
  pvVar1 = (ab2b_->write_).shared_alloc_.direct_ptr;
  (this->super_Graph).a2ab.write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->super_Graph).a2ab.write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->super_Graph).ab2b.write_.shared_alloc_.alloc = pAVar3;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->super_Graph).ab2b.write_.shared_alloc_.alloc = (Alloc *)(pAVar3->size * 8 + 1);
      iVar2 = pAVar3->use_count + -1;
    }
    else {
      iVar2 = pAVar3->use_count;
    }
    (this->super_Graph).ab2b.write_.shared_alloc_.direct_ptr = pvVar1;
    pAVar3->use_count = iVar2;
    if (iVar2 == 0) {
      Alloc::~Alloc(pAVar3);
      operator_delete(pAVar3,0x48);
    }
  }
  else {
    (this->super_Graph).ab2b.write_.shared_alloc_.direct_ptr = pvVar1;
  }
  pAVar3 = (codes_->write_).shared_alloc_.alloc;
  (this->codes).write_.shared_alloc_.alloc = pAVar3;
  if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->codes).write_.shared_alloc_.alloc = (Alloc *)(pAVar3->size * 8 + 1);
    }
    else {
      pAVar3->use_count = pAVar3->use_count + 1;
    }
  }
  (this->codes).write_.shared_alloc_.direct_ptr = (codes_->write_).shared_alloc_.direct_ptr;
  return;
}

Assistant:

Adj(LOs ab2b_, Read<I8> codes_) : Graph(ab2b_), codes(codes_) {}